

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall
RoboClaw::SpeedAccelDistanceM1M2_2
          (RoboClaw *this,uint32_t accel1,uint32_t speed1,uint32_t distance1,uint32_t accel2,
          uint32_t speed2,uint32_t distance2,uint8_t flag)

{
  bool bVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  RoboClaw *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  byte in_stack_00000010;
  
  bVar1 = write_n(in_RDI,'\x1b',(ulong)in_RDI->m_address,0x33,(ulong)(in_ESI >> 0x18),
                  (ulong)(in_ESI >> 0x10 & 0xff),in_ESI >> 8 & 0xff,in_ESI & 0xff,in_EDX >> 0x18,
                  in_EDX >> 0x10 & 0xff,in_EDX >> 8 & 0xff,in_EDX & 0xff,in_ECX >> 0x18,
                  in_ECX >> 0x10 & 0xff,in_ECX >> 8 & 0xff,in_ECX & 0xff,in_R8D >> 0x18,
                  in_R8D >> 0x10 & 0xff,in_R8D >> 8 & 0xff,in_R8D & 0xff,in_R9D >> 0x18,
                  in_R9D >> 0x10 & 0xff,in_R9D >> 8 & 0xff,in_R9D & 0xff,in_stack_00000008 >> 0x18,
                  in_stack_00000008 >> 0x10 & 0xff,in_stack_00000008 >> 8 & 0xff,
                  in_stack_00000008 & 0xff,(uint)in_stack_00000010);
  return bVar1;
}

Assistant:

bool RoboClaw::SpeedAccelDistanceM1M2_2( uint32_t accel1, uint32_t speed1, uint32_t distance1, uint32_t accel2, uint32_t speed2, uint32_t distance2, uint8_t flag)
{
    return write_n(27, m_address, MIXEDSPEED2ACCELDIST,SetDWORDval(accel1),SetDWORDval(speed1),SetDWORDval(distance1),SetDWORDval(accel2),SetDWORDval(speed2),SetDWORDval(distance2),flag);
}